

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O1

string * __thiscall
Assimp::FBX::FBXConverter::FixAnimMeshName
          (string *__return_storage_ptr__,FBXConverter *this,string *name)

{
  size_type sVar1;
  pointer pcVar2;
  ulong uVar3;
  
  if (((name->_M_string_length != 0) &&
      (uVar3 = std::__cxx11::string::find_first_of((char *)name,0x1f3624,0),
      uVar3 != 0xffffffffffffffff)) && (uVar3 < name->_M_string_length - 2)) {
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)name);
    return __return_storage_ptr__;
  }
  sVar1 = name->_M_string_length;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (sVar1 == 0) {
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"AnimMesh","");
  }
  else {
    pcVar2 = (name->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + sVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FBXConverter::FixAnimMeshName(const std::string& name) {
            if (name.length()) {
                size_t indexOf = name.find_first_of("::");
                if (indexOf != std::string::npos && indexOf < name.size() - 2) {
                    return name.substr(indexOf + 2);
                }
            }
            return name.length() ? name : "AnimMesh";
        }